

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall Fifteen::setColor(Fifteen *this)

{
  pointer puVar1;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar2;
  unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *tile;
  pointer puVar3;
  QArrayData *local_40;
  long local_30;
  
  Options::getTileColor();
  pvVar2 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  puVar1 = (pvVar2->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (pvVar2->
                super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    QAbstractButton::text();
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,2,8);
      }
    }
    if (local_30 != 0) {
      QWidget::setStyleSheet
                ((QString *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                 super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                 super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    }
  }
  return;
}

Assistant:

void Fifteen::setColor()
{
    auto& tileColor = Options::getTileColor();

    for ( auto& tile : tilesBoard->getTiles() )
    {
        if ( tile->text() != nullptr )
        {
            tile->setStyleSheet( tileColor );
        }
    }    
}